

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int resolve_must(lyd_node *node,int inout_parent,int ignore_fail)

{
  byte bVar1;
  uint16_t uVar2;
  LYS_NODE LVar3;
  char *pcVar4;
  char *expr;
  int iVar5;
  lys_node *node_00;
  lys_module *plVar6;
  LY_ERR *pLVar7;
  uint8_t *puVar8;
  undefined8 uVar9;
  long lVar10;
  undefined1 auStack_78 [8];
  lyxp_set set;
  
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x160e,"int resolve_must(struct lyd_node *, int, int)");
  }
  set.val._8_8_ = 0;
  set.used = 0;
  set.size = 0;
  set._8_8_ = 0;
  set.val.nodes = (lyxp_set_nodes *)0x0;
  auStack_78 = (undefined1  [8])0x0;
  set.type = LYXP_SET_EMPTY;
  set._4_4_ = 0;
  node_00 = node->schema;
  if (inout_parent == 0) {
    LVar3 = node_00->nodetype;
    if ((int)LVar3 < 0x10) {
      if (LVar3 != LYS_CONTAINER) {
        if ((LVar3 != LYS_LEAF) && (LVar3 != LYS_LEAFLIST)) {
          return 0;
        }
        goto LAB_0011b87f;
      }
      lVar10 = 0x1e;
    }
    else {
      if ((int)LVar3 < 0x80) {
        if (LVar3 == LYS_LIST) {
          lVar10 = 0x1c;
          goto LAB_0011b884;
        }
        if (LVar3 != LYS_ANYXML) {
          return 0;
        }
      }
      else if ((LVar3 != LYS_NOTIF) && (LVar3 != LYS_ANYDATA)) {
        return 0;
      }
LAB_0011b87f:
      lVar10 = 0x1f;
    }
LAB_0011b884:
    puVar8 = node_00->padding + lVar10 + -0x1c;
LAB_0011b887:
    bVar1 = *puVar8;
    if ((ulong)bVar1 != 0) {
      pcVar4 = node_00[1].dsc;
      uVar2 = node_00->flags;
      lVar10 = 0;
      do {
        expr = *(char **)(pcVar4 + lVar10);
        plVar6 = lyd_node_module(node);
        iVar5 = lyxp_eval(expr,node,LYXP_NODE_ELEM,plVar6,(lyxp_set *)auStack_78,1);
        if (iVar5 != 0) goto LAB_0011b825;
        plVar6 = lyd_node_module(node);
        lyxp_set_cast((lyxp_set *)auStack_78,LYXP_SET_BOOLEAN,node,plVar6,1);
        if (set._8_4_ == 0) {
          if ((ignore_fail == 2 & (byte)(uVar2 >> 9) & 1) == 0 && ignore_fail != 1) {
            ly_vlog(LYE_NOMUST,LY_VLOG_LYD,node,*(undefined8 *)(pcVar4 + lVar10));
            if (*(long *)(pcVar4 + lVar10 + 0x20) != 0) {
              ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0);
            }
            if (*(long *)(pcVar4 + lVar10 + 0x18) == 0) {
              return 1;
            }
            pLVar7 = ly_errno_location();
            strncpy((char *)(pLVar7 + 0x206),*(char **)(pcVar4 + lVar10 + 0x18),0x7f);
            return 1;
          }
          if ('\x01' < ly_log_level) {
            ly_log(LY_LLVRB,"Must condition \"%s\" not satisfied, but it is not required.",
                   *(undefined8 *)(pcVar4 + lVar10));
          }
        }
        lVar10 = lVar10 + 0x38;
      } while ((ulong)bVar1 * 0x38 != lVar10);
    }
    iVar5 = 0;
  }
  else {
    do {
      node_00 = lys_parent(node_00);
      if (node_00 == (lys_node *)0x0) goto LAB_0011b7fe;
    } while ((node_00->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN);
    if ((node_00->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
LAB_0011b7fe:
      pLVar7 = ly_errno_location();
      *pLVar7 = LY_EINT;
      uVar9 = 0x1616;
    }
    else {
      node = node->parent;
      if ((node->schema->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) {
        puVar8 = node_00->padding + 3;
        goto LAB_0011b887;
      }
      pLVar7 = ly_errno_location();
      *pLVar7 = LY_EINT;
      uVar9 = 0x1621;
    }
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c",
           uVar9);
LAB_0011b825:
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

static int
resolve_must(struct lyd_node *node, int inout_parent, int ignore_fail)
{
    int node_flags;
    uint8_t i, must_size;
    struct lys_node *schema;
    struct lys_restr *must;
    struct lyxp_set set;

    assert(node);
    memset(&set, 0, sizeof set);

    if (inout_parent) {
        for (schema = lys_parent(node->schema);
             schema && (schema->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES));
             schema = lys_parent(schema));
        if (!schema || !(schema->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
            LOGINT;
            return -1;
        }
        must_size = ((struct lys_node_inout *)schema)->must_size;
        must = ((struct lys_node_inout *)schema)->must;

        node_flags = schema->flags;

        /* context node is the RPC/action */
        node = node->parent;
        if (!(node->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
            LOGINT;
            return -1;
        }
    } else {
        switch (node->schema->nodetype) {
        case LYS_CONTAINER:
            must_size = ((struct lys_node_container *)node->schema)->must_size;
            must = ((struct lys_node_container *)node->schema)->must;
            break;
        case LYS_LEAF:
            must_size = ((struct lys_node_leaf *)node->schema)->must_size;
            must = ((struct lys_node_leaf *)node->schema)->must;
            break;
        case LYS_LEAFLIST:
            must_size = ((struct lys_node_leaflist *)node->schema)->must_size;
            must = ((struct lys_node_leaflist *)node->schema)->must;
            break;
        case LYS_LIST:
            must_size = ((struct lys_node_list *)node->schema)->must_size;
            must = ((struct lys_node_list *)node->schema)->must;
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            must_size = ((struct lys_node_anydata *)node->schema)->must_size;
            must = ((struct lys_node_anydata *)node->schema)->must;
            break;
        case LYS_NOTIF:
            must_size = ((struct lys_node_notif *)node->schema)->must_size;
            must = ((struct lys_node_notif *)node->schema)->must;
            break;
        default:
            must_size = 0;
            break;
        }

        node_flags = node->schema->flags;
    }

    for (i = 0; i < must_size; ++i) {
        if (lyxp_eval(must[i].expr, node, LYXP_NODE_ELEM, lyd_node_module(node), &set, LYXP_MUST)) {
            return -1;
        }

        lyxp_set_cast(&set, LYXP_SET_BOOLEAN, node, lyd_node_module(node), LYXP_MUST);

        if (!set.val.bool) {
            if ((ignore_fail == 1) || ((node_flags & LYS_XPATH_DEP) && (ignore_fail == 2))) {
                LOGVRB("Must condition \"%s\" not satisfied, but it is not required.", must[i].expr);
            } else {
                LOGVAL(LYE_NOMUST, LY_VLOG_LYD, node, must[i].expr);
                if (must[i].emsg) {
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, must[i].emsg);
                }
                if (must[i].eapptag) {
                    strncpy(((struct ly_err *)&ly_errno)->apptag, must[i].eapptag, LY_APPTAG_LEN - 1);
                }
                return 1;
            }
        }
    }

    return EXIT_SUCCESS;
}